

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2cdev.cpp
# Opt level: O2

bool __thiscall I2Cdev::writeWords(I2Cdev *this,uint8_t regAddr,uint8_t length,uint16_t *data)

{
  FILE *pFVar1;
  int __fd;
  int iVar2;
  ssize_t sVar3;
  int *piVar4;
  char *pcVar5;
  ulong uVar6;
  undefined7 in_register_00000011;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint8_t buf [128];
  
  iVar8 = (int)CONCAT71(in_register_00000011,length);
  if (length < 0x40) {
    __fd = open(&(this->super_I2Cgeneric).field_0xd,2);
    pFVar1 = _stderr;
    if (__fd < 0) {
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      fprintf(pFVar1,"Failed to open device: %s\n",pcVar5);
    }
    else {
      iVar2 = ioctl(__fd,0x703,(ulong)(byte)(this->super_I2Cgeneric).field_0xc);
      pFVar1 = _stderr;
      if (iVar2 < 0) {
        piVar4 = __errno_location();
        pcVar5 = strerror(*piVar4);
        fprintf(pFVar1,"Failed to select device: %s\n",pcVar5);
      }
      else {
        for (uVar6 = 0; length != uVar6; uVar6 = uVar6 + 1) {
          *(uint16_t *)(buf + uVar6 * 2 + 1) = data[uVar6] << 8 | data[uVar6] >> 8;
        }
        uVar7 = iVar8 * 2 + 1;
        buf[0] = regAddr;
        sVar3 = write(__fd,buf,(ulong)uVar7);
        pFVar1 = _stderr;
        uVar9 = (uint)(char)sVar3;
        if ((char)sVar3 < '\0') {
          piVar4 = __errno_location();
          pcVar5 = strerror(*piVar4);
          fprintf(pFVar1,"Failed to write device(%d): %s\n",(ulong)uVar9,pcVar5);
        }
        else {
          if (uVar9 == uVar7) {
            close(__fd);
            return true;
          }
          fprintf(_stderr,"Short write to device, expected %d, got %d\n",(ulong)(iVar8 + 1),
                  (ulong)uVar9);
        }
      }
      close(__fd);
    }
  }
  else {
    fprintf(_stderr,"Word write count (%d) > 63\n",
            CONCAT71(in_register_00000011,length) & 0xffffffff);
  }
  return false;
}

Assistant:

bool I2Cdev::writeWords(uint8_t regAddr, uint8_t length, uint16_t* data) {
    int8_t count = 0;
    uint8_t buf[128];
    int i, fd;

    // Should do potential byteswap and call writeBytes() really, but that
    // messes with the callers buffer

    if (length > 63) {
        fprintf(stderr, "Word write count (%d) > 63\n", length);
        return(FALSE);
    }

    fd = open(this->i2c_path, O_RDWR);
    if (fd < 0) {
        fprintf(stderr, "Failed to open device: %s\n", strerror(errno));
        return(FALSE);
    }
    if (ioctl(fd, I2C_SLAVE, this->address) < 0) {
        fprintf(stderr, "Failed to select device: %s\n", strerror(errno));
        close(fd);
        return(FALSE);
    }
    buf[0] = regAddr;
    for (i = 0; i < length; i++) {
        buf[i*2+1] = data[i] >> 8;
        buf[i*2+2] = data[i];
    }
    count = write(fd, buf, length*2+1);
    if (count < 0) {
        fprintf(stderr, "Failed to write device(%d): %s\n", count, ::strerror(errno));
        close(fd);
        return(FALSE);
    } else if (count != length*2+1) {
        fprintf(stderr, "Short write to device, expected %d, got %d\n", length+1, count);
        close(fd);
        return(FALSE);
    }
    close(fd);
    return TRUE;
}